

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

InplaceStr
GetDefaultArgumentWrapperFunctionName
          (ExpressionContext *ctx,FunctionData *function,InplaceStr argumentName)

{
  char *pcVar1;
  int iVar2;
  undefined4 extraout_var;
  size_t sVar3;
  uint uVar4;
  ulong size;
  InplaceStr IVar5;
  
  uVar4 = (int)argumentName.end - (int)argumentName.begin;
  size = (ulong)(uVar4 + (*(int *)&(function->name->name).end -
                         *(int *)&(function->name->name).begin) + 0x10);
  iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,size);
  IVar5.begin = (char *)CONCAT44(extraout_var,iVar2);
  pcVar1 = (function->name->name).begin;
  NULLC::SafeSprintf(IVar5.begin,size,"%.*s_%u_%.*s$",
                     (ulong)(uint)(*(int *)&(function->name->name).end - (int)pcVar1),pcVar1,
                     (ulong)(function->type->super_TypeBase).nameHash,(ulong)uVar4,
                     argumentName.begin);
  sVar3 = strlen(IVar5.begin);
  IVar5.end = IVar5.begin + sVar3;
  return IVar5;
}

Assistant:

InplaceStr GetDefaultArgumentWrapperFunctionName(ExpressionContext &ctx, FunctionData *function, InplaceStr argumentName)
{
	unsigned length = function->name->name.length() + argumentName.length() + 16;
	char *name = (char*)ctx.allocator->alloc(length);
	NULLC::SafeSprintf(name, length, "%.*s_%u_%.*s$", FMT_ISTR(function->name->name), function->type->nameHash, FMT_ISTR(argumentName));

	return InplaceStr(name);
}